

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_robertson_constraints.c
# Opt level: O1

int main(void)

{
  undefined8 *puVar1;
  double *pdVar2;
  uint uVar3;
  N_Vector y;
  long lVar4;
  long lVar5;
  long lVar6;
  FILE *__s;
  char *pcVar7;
  int iVar8;
  double dVar9;
  sunrealtype t_00;
  double rtol;
  double atol;
  void *arkode_mem;
  SUNContext ctx;
  sunrealtype t;
  long nctf;
  long netf;
  long ncfn;
  long nnf;
  long nni;
  long nfeLS;
  long nje;
  long nsetups;
  long nfi;
  long nfe;
  long nst_a;
  long nst;
  long local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  double local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  local_c8 = 0;
  uVar3 = SUNContext_Create(0,&local_c0);
  if ((int)uVar3 < 0) {
    pcVar7 = "SUNContext_Create";
  }
  else {
    puts("\nRobertson ODE test problem:");
    printf("    initial conditions:  u0 = %g,  v0 = %g,  w0 = %g\n",0x3ff0000000000000,0,0);
    y = (N_Vector)N_VNew_Serial(3,local_c0);
    if (y == (N_Vector)0x0) {
      main_cold_5();
      return 1;
    }
    puVar1 = *(undefined8 **)((long)y->content + 0x10);
    *puVar1 = 0x3ff0000000000000;
    puVar1[1] = 0;
    puVar1[2] = 0;
    lVar4 = N_VClone(y);
    if (lVar4 == 0) {
      main_cold_4();
      return 1;
    }
    N_VConst(0x3ff0000000000000,lVar4);
    local_c8 = ARKStepCreate(0,0,f,y,local_c0);
    if (local_c8 == 0) {
      main_cold_3();
      return 1;
    }
    uVar3 = ARKodeSetInitStep(0x3e7ad7f29abcaf49,local_c8);
    if ((int)uVar3 < 0) {
      pcVar7 = "ARKodeSetInitStep";
    }
    else {
      uVar3 = ARKodeSetMaxErrTestFails(local_c8,0x14);
      if ((int)uVar3 < 0) {
        pcVar7 = "ARKodeSetMaxErrTestFails";
      }
      else {
        uVar3 = ARKodeSetMaxNonlinIters(local_c8,8);
        if ((int)uVar3 < 0) {
          pcVar7 = "ARKodeSetMaxNonlinIters";
        }
        else {
          uVar3 = ARKodeSetNonlinConvCoef(0x3e7ad7f29abcaf48,local_c8);
          if ((int)uVar3 < 0) {
            pcVar7 = "ARKodeSetNonlinConvCoef";
          }
          else {
            uVar3 = ARKodeSetMaxNumSteps(local_c8,100000);
            if (-1 < (int)uVar3) {
              uVar3 = ARKodeSetPredictorMethod(local_c8,1);
              if ((int)uVar3 < 0) {
                pcVar7 = "ARKodeSetPredictorMethod";
              }
              else {
                uVar3 = ARKodeSStolerances(0x3f50624dd2f1a9fc,0x3e7ad7f29abcaf48,local_c8);
                if ((int)uVar3 < 0) {
                  pcVar7 = "ARKodeSStolerances";
                }
                else {
                  uVar3 = ARKodeSetConstraints(local_c8,lVar4);
                  if ((int)uVar3 < 0) {
                    pcVar7 = "ARKodeSetConstraints";
                  }
                  else {
                    lVar5 = SUNDenseMatrix(3,3,local_c0);
                    if (lVar5 == 0) {
                      main_cold_2();
                      return 1;
                    }
                    lVar6 = SUNLinSol_Dense(y,lVar5,local_c0);
                    if (lVar6 == 0) {
                      main_cold_1();
                      return 1;
                    }
                    uVar3 = ARKodeSetLinearSolver(local_c8,lVar6,lVar5);
                    if ((int)uVar3 < 0) {
                      pcVar7 = "ARKodeSetLinearSolver";
                    }
                    else {
                      uVar3 = ARKodeSetJacFn(local_c8,Jac);
                      if (-1 < (int)uVar3) {
                        local_b0 = lVar6;
                        local_a8 = lVar5;
                        local_a0 = lVar4;
                        __s = fopen("solution.txt","w");
                        fwrite("# t u v w\n",10,1,__s);
                        puVar1 = *(undefined8 **)((long)y->content + 0x10);
                        fprintf(__s," %.16e %.16e %.16e %.16e\n",0,*puVar1,puVar1[1],puVar1[2]);
                        local_b8 = 0;
                        puts("        t           u           v           w");
                        puts("   --------------------------------------------------");
                        pdVar2 = *(double **)((long)y->content + 0x10);
                        rtol = *pdVar2;
                        atol = pdVar2[1];
                        printf("  %10.3e  %12.5e  %12.5e  %12.5e\n",local_b8,rtol,atol,pdVar2[2]);
                        dVar9 = 1000000000.0;
                        iVar8 = 100;
                        do {
                          local_98 = dVar9;
                          uVar3 = ARKodeEvolve(local_c8,y,&local_b8,1);
                          if ((int)uVar3 < 0) {
                            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                                    "ARKodeEvolve",(ulong)uVar3);
                            break;
                          }
                          puVar1 = *(undefined8 **)((long)y->content + 0x10);
                          printf("  %10.3e  %12.5e  %12.5e  %12.5e\n",local_b8,*puVar1,puVar1[1],
                                 puVar1[2]);
                          puVar1 = *(undefined8 **)((long)y->content + 0x10);
                          atol = (double)puVar1[1];
                          fprintf(__s," %.16e %.16e %.16e %.16e\n",local_b8,*puVar1,atol,puVar1[2]);
                          rtol = local_98 + 1000000000.0;
                          dVar9 = 100000000000.0;
                          if (rtol <= 100000000000.0) {
                            dVar9 = rtol;
                          }
                          iVar8 = iVar8 + -1;
                        } while (iVar8 != 0);
                        puts("   --------------------------------------------------");
                        fclose(__s);
                        uVar3 = ARKodeGetNumSteps(local_c8,&local_38);
                        if ((int)uVar3 < 0) {
                          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                                  "ARKodeGetNumSteps",(ulong)uVar3);
                        }
                        uVar3 = ARKodeGetNumStepAttempts(local_c8,&local_40);
                        lVar6 = local_a0;
                        lVar5 = local_a8;
                        lVar4 = local_b0;
                        if ((int)uVar3 < 0) {
                          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                                  "ARKodeGetNumStepAttempts",(ulong)uVar3);
                        }
                        uVar3 = ARKStepGetNumRhsEvals(local_c8,&local_48,&local_50);
                        if ((int)uVar3 < 0) {
                          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                                  "ARKStepGetNumRhsEvals",(ulong)uVar3);
                        }
                        uVar3 = ARKodeGetNumLinSolvSetups(local_c8,&local_58);
                        if ((int)uVar3 < 0) {
                          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                                  "ARKodeGetNumLinSolvSetups",(ulong)uVar3);
                        }
                        uVar3 = ARKodeGetNumErrTestFails(local_c8,&local_88);
                        if ((int)uVar3 < 0) {
                          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                                  "ARKodeGetNumErrTestFails",(ulong)uVar3);
                        }
                        uVar3 = ARKodeGetNumStepSolveFails(local_c8,&local_80);
                        if ((int)uVar3 < 0) {
                          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                                  "ARKodeGetNumStepSolveFails",(ulong)uVar3);
                        }
                        uVar3 = ARKodeGetNumNonlinSolvIters(local_c8,&local_70);
                        if ((int)uVar3 < 0) {
                          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                                  "ARKodeGetNumNonlinSolvIters",(ulong)uVar3);
                        }
                        uVar3 = ARKodeGetNumNonlinSolvConvFails(local_c8,&local_78);
                        if ((int)uVar3 < 0) {
                          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                                  "ARKodeGetNumNonlinSolvConvFails",(ulong)uVar3);
                        }
                        uVar3 = ARKodeGetNumJacEvals(local_c8,&local_60);
                        if ((int)uVar3 < 0) {
                          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                                  "ARKodeGetNumJacEvals",(ulong)uVar3);
                        }
                        uVar3 = ARKodeGetNumLinRhsEvals(local_c8,&local_68);
                        if ((int)uVar3 < 0) {
                          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                                  "ARKodeGetNumLinRhsEvals",(ulong)uVar3);
                        }
                        uVar3 = ARKodeGetNumConstrFails(local_c8,&local_90);
                        if ((int)uVar3 < 0) {
                          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                                  "ARKodeGetNumConstrFails",(ulong)uVar3);
                        }
                        puts("\nFinal Solver Statistics:");
                        printf("   Internal solver steps = %li (attempted = %li)\n",local_38,
                               local_40);
                        printf("   Total RHS evals:  Fe = %li,  Fi = %li\n",local_48,local_50);
                        printf("   Total linear solver setups = %li\n",local_58);
                        printf("   Total RHS evals for setting up the linear system = %li\n",
                               local_68);
                        printf("   Total number of Jacobian evaluations = %li\n",local_60);
                        printf("   Total number of Newton iterations = %li\n",local_70);
                        printf("   Total number of nonlinear solver convergence failures = %li\n",
                               local_78);
                        printf("   Total number of error test failures = %li\n",local_88);
                        printf("   Total number of constraint test failures = %li\n",local_90);
                        printf("   Total number of failed steps from solver failure = %li\n",
                               local_80);
                        iVar8 = check_ans(y,t_00,rtol,atol);
                        N_VDestroy(y);
                        N_VDestroy(lVar6);
                        ARKodeFree(&local_c8);
                        SUNLinSolFree(lVar4);
                        SUNMatDestroy(lVar5);
                        SUNContext_Free(&local_c0);
                        return iVar8;
                      }
                      pcVar7 = "ARKodeSetJacFn";
                    }
                  }
                }
              }
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",pcVar7,(ulong)uVar3
                     );
              return 1;
            }
            pcVar7 = "ARKodeSetMaxNumSteps";
          }
        }
      }
    }
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",pcVar7,(ulong)uVar3);
  return 1;
}

Assistant:

int main(void)
{
  sunrealtype ONE = SUN_RCONST(1.0);

  /* general problem parameters */
  sunrealtype T0    = SUN_RCONST(0.0);       /* initial time */
  sunrealtype Tf    = SUN_RCONST(1.e11);     /* final time */
  sunrealtype dTout = (Tf - T0) / 100;       /* time between outputs */
  int Nt            = (int)ceil(Tf / dTout); /* number of output times */
  sunindextype NEQ  = 3;                     /* number of dependent vars. */

  /* general problem variables */
  int flag;                    /* reusable error-checking flag */
  N_Vector y           = NULL; /* empty vector for storing solution */
  N_Vector constraints = NULL; /* empty vector for storing constraints */
  SUNMatrix A          = NULL; /* empty matrix for linear solver */
  SUNLinearSolver LS   = NULL; /* empty linear solver object */
  void* arkode_mem     = NULL; /* empty ARKode memory structure */
  FILE* UFID;
  sunrealtype t, tout;
  int iout;
  long int nst, nst_a, nfe, nfi, nsetups, nje, nfeLS, nni, nnf, ncfn, netf, nctf;

  /* set up the initial conditions, tolerances, initial time step size */
  sunrealtype u0     = SUN_RCONST(1.0);
  sunrealtype v0     = SUN_RCONST(0.0);
  sunrealtype w0     = SUN_RCONST(0.0);
  sunrealtype reltol = SUN_RCONST(1.0e-3);
  sunrealtype abstol = SUN_RCONST(1.0e-7);
  sunrealtype h0     = SUN_RCONST(1.0e-4) * reltol;

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* Initial problem output */
  printf("\nRobertson ODE test problem:\n");
  printf("    initial conditions:  u0 = %" GSYM ",  v0 = %" GSYM
         ",  w0 = %" GSYM "\n",
         u0, v0, w0);

  /* Initialize data structures */
  y = N_VNew_Serial(NEQ, ctx); /* Create serial vector for solution */
  if (check_flag((void*)y, "N_VNew_Serial", 0)) { return 1; }
  NV_Ith_S(y, 0) = u0; /* Set initial conditions into y */
  NV_Ith_S(y, 1) = v0;
  NV_Ith_S(y, 2) = w0;

  constraints = N_VClone(y);
  if (check_flag((void*)constraints, "N_VNew_Serial", 0)) { return 1; }
  /* Set constraints to all 1's for nonnegative solution values. */
  N_VConst(ONE, constraints);

  /* Call ARKStepCreate to initialize the ARK timestepper module and
     specify the right-hand side function in y'=f(t,y), the inital time
     T0, and the initial dependent variable vector y.  Note: since this
     problem is fully implicit, we set f_E to NULL and f_I to f. */
  arkode_mem = ARKStepCreate(NULL, f, T0, y, ctx);
  if (check_flag((void*)arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Set routines */
  flag = ARKodeSetInitStep(arkode_mem, h0); /* Set custom initial step */
  if (check_flag(&flag, "ARKodeSetInitStep", 1)) { return 1; }
  flag = ARKodeSetMaxErrTestFails(arkode_mem,
                                  20); /* Increase max error test fails */
  if (check_flag(&flag, "ARKodeSetMaxErrTestFails", 1)) { return 1; }
  flag = ARKodeSetMaxNonlinIters(arkode_mem, 8); /* Increase max nonlin iters  */
  if (check_flag(&flag, "ARKodeSetMaxNonlinIters", 1)) { return 1; }
  flag = ARKodeSetNonlinConvCoef(arkode_mem,
                                 SUN_RCONST(1.e-7)); /* Set nonlinear convergence coeff. */
  if (check_flag(&flag, "ARKodeSetNonlinConvCoef", 1)) { return 1; }
  flag = ARKodeSetMaxNumSteps(arkode_mem, 100000); /* Increase max num steps */
  if (check_flag(&flag, "ARKodeSetMaxNumSteps", 1)) { return 1; }
  flag = ARKodeSetPredictorMethod(arkode_mem,
                                  1); /* Specify maximum-order predictor */
  if (check_flag(&flag, "ARKodeSetPredictorMethod", 1)) { return 1; }
  flag = ARKodeSStolerances(arkode_mem, reltol, abstol); /* Specify tolerances */
  if (check_flag(&flag, "ARKodeSStolerances", 1)) { return 1; }
  flag = ARKodeSetConstraints(arkode_mem, constraints); /* Set constraints */
  if (check_flag(&flag, "ARKodeSetConstraints", 1)) { return 1; }

  /* Initialize dense matrix data structure and solver */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_flag((void*)A, "SUNDenseMatrix", 0)) { return 1; }
  LS = SUNLinSol_Dense(y, A, ctx);
  if (check_flag((void*)LS, "SUNLinSol_Dense", 0)) { return 1; }

  /* Linear solver interface */
  flag = ARKodeSetLinearSolver(arkode_mem, LS,
                               A); /* Attach matrix and linear solver */
  if (check_flag(&flag, "ARKodeSetLinearSolver", 1)) { return 1; }
  flag = ARKodeSetJacFn(arkode_mem, Jac); /* Set the Jacobian routine */
  if (check_flag(&flag, "ARKodeSetJacFn", 1)) { return 1; }

  /* Open output stream for results, output comment line */
  UFID = fopen("solution.txt", "w");
  fprintf(UFID, "# t u v w\n");

  /* output initial condition to disk */
  fprintf(UFID, " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n", T0,
          NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results.  Stops when the final time has been reached */
  t    = T0;
  tout = T0 + dTout;
  printf("        t           u           v           w\n");
  printf("   --------------------------------------------------\n");
  printf("  %10.3" ESYM "  %12.5" ESYM "  %12.5" ESYM "  %12.5" ESYM "\n", t,
         NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
  for (iout = 0; iout < Nt; iout++)
  {
    flag = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL); /* call integrator */
    if (check_flag(&flag, "ARKodeEvolve", 1)) { break; }
    printf("  %10.3" ESYM "  %12.5" ESYM "  %12.5" ESYM "  %12.5" ESYM
           "\n", /* access/print solution */
           t, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    fprintf(UFID, " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n", t,
            NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    if (flag >= 0)
    { /* successful solve: update time */
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
  }
  printf("   --------------------------------------------------\n");
  fclose(UFID);

  /* Print some final statistics */
  flag = ARKodeGetNumSteps(arkode_mem, &nst);
  check_flag(&flag, "ARKodeGetNumSteps", 1);
  flag = ARKodeGetNumStepAttempts(arkode_mem, &nst_a);
  check_flag(&flag, "ARKodeGetNumStepAttempts", 1);
  flag = ARKStepGetNumRhsEvals(arkode_mem, &nfe, &nfi);
  check_flag(&flag, "ARKStepGetNumRhsEvals", 1);
  flag = ARKodeGetNumLinSolvSetups(arkode_mem, &nsetups);
  check_flag(&flag, "ARKodeGetNumLinSolvSetups", 1);
  flag = ARKodeGetNumErrTestFails(arkode_mem, &netf);
  check_flag(&flag, "ARKodeGetNumErrTestFails", 1);
  flag = ARKodeGetNumStepSolveFails(arkode_mem, &ncfn);
  check_flag(&flag, "ARKodeGetNumStepSolveFails", 1);
  flag = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
  check_flag(&flag, "ARKodeGetNumNonlinSolvIters", 1);
  flag = ARKodeGetNumNonlinSolvConvFails(arkode_mem, &nnf);
  check_flag(&flag, "ARKodeGetNumNonlinSolvConvFails", 1);
  flag = ARKodeGetNumJacEvals(arkode_mem, &nje);
  check_flag(&flag, "ARKodeGetNumJacEvals", 1);
  flag = ARKodeGetNumLinRhsEvals(arkode_mem, &nfeLS);
  check_flag(&flag, "ARKodeGetNumLinRhsEvals", 1);
  flag = ARKodeGetNumConstrFails(arkode_mem, &nctf);
  check_flag(&flag, "ARKodeGetNumConstrFails", 1);

  printf("\nFinal Solver Statistics:\n");
  printf("   Internal solver steps = %li (attempted = %li)\n", nst, nst_a);
  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n", nfe, nfi);
  printf("   Total linear solver setups = %li\n", nsetups);
  printf("   Total RHS evals for setting up the linear system = %li\n", nfeLS);
  printf("   Total number of Jacobian evaluations = %li\n", nje);
  printf("   Total number of Newton iterations = %li\n", nni);
  printf("   Total number of nonlinear solver convergence failures = %li\n", nnf);
  printf("   Total number of error test failures = %li\n", netf);
  printf("   Total number of constraint test failures = %li\n", nctf);
  printf("   Total number of failed steps from solver failure = %li\n", ncfn);

  /* check the solution error */
  flag = check_ans(y, t, reltol, abstol);

  /* Clean up and return with successful completion */
  N_VDestroy(y);           /* Free y vector */
  N_VDestroy(constraints); /* Free constraints vector */
  ARKodeFree(&arkode_mem); /* Free integrator memory */
  SUNLinSolFree(LS);       /* Free linear solver */
  SUNMatDestroy(A);        /* Free A matrix */
  SUNContext_Free(&ctx);   /* Free context */

  return flag;
}